

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH41
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  BrotliEncoderDictionary *pBVar5;
  void *pvVar6;
  void *pvVar7;
  HasherCommon *pHVar8;
  uint8_t *puVar9;
  ulong uVar10;
  BrotliDictionary *pBVar11;
  bool bVar12;
  int iVar13;
  ulong uVar14;
  uint32_t uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong *puVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  ushort uVar22;
  uint uVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong *puVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  uint16_t uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  size_t sVar35;
  ulong *puVar36;
  ulong *puVar37;
  ulong uVar38;
  ushort uVar39;
  long lVar40;
  char cVar41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  size_t sVar50;
  ulong uVar51;
  size_t key;
  ulong uVar52;
  ulong uVar53;
  bool bVar54;
  int local_164;
  ulong local_160;
  size_t local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_108;
  ulong local_f8;
  Command *local_e8;
  ulong local_d0;
  ulong local_c8;
  uint local_b4;
  ulong local_a8;
  uint8_t *s1_orig_1;
  int last_distance;
  
  iVar28 = params->lgwin;
  sVar3 = params->stream_offset;
  local_150 = *last_insert_len;
  uVar16 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar16 = position;
  }
  uVar2 = num_bytes + position;
  lVar40 = 0x200;
  if (params->quality < 9) {
    lVar40 = 0x40;
  }
  sVar4 = (params->dictionary).compound.total_size;
  iVar42 = *dist_cache;
  dist_cache[4] = iVar42 + -1;
  dist_cache[5] = iVar42 + 1;
  dist_cache[6] = iVar42 + -2;
  dist_cache[7] = iVar42 + 2;
  *(ulong *)(dist_cache + 8) = CONCAT44(iVar42 + 3,iVar42 + -3);
  if (position + 4 < uVar2) {
    uVar29 = (1L << ((byte)iVar28 & 0x3f)) - 0x10;
    local_a8 = lVar40 + position;
    lVar1 = sVar4 + 1;
    local_e8 = commands;
    local_160 = position;
    do {
      uVar20 = uVar29;
      if (local_160 < uVar29) {
        uVar20 = local_160;
      }
      uVar38 = sVar3 + local_160;
      if (uVar29 <= sVar3 + local_160) {
        uVar38 = uVar29;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_b4 = 0;
        local_d0 = 0;
      }
      else {
        if (local_160 == 0) {
          local_d0 = 0;
        }
        else {
          local_d0 = (ulong)ringbuffer[local_160 - 1 & ringbuffer_mask];
        }
        if (local_160 < 2) {
          uVar27 = 0;
        }
        else {
          uVar27 = (ulong)ringbuffer[local_160 - 2 & ringbuffer_mask];
        }
        local_b4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar27 + 0x100] | literal_context_lut[local_d0]];
      }
      local_140 = uVar2 - local_160;
      pBVar5 = (params->dictionary).contextual.dict[local_b4];
      uVar27 = (params->dist).max_distance;
      pvVar6 = (hasher->privat)._H40.extra[0];
      pvVar7 = (hasher->privat)._H40.extra[1];
      uVar17 = local_160 & ringbuffer_mask;
      puVar18 = (ulong *)(ringbuffer + uVar17);
      uVar23 = (uint)(*(int *)(ringbuffer + uVar17) * 0x1e35a7bd) >> 0x11;
      local_148 = 0x7e4;
      local_120 = 0;
      lVar19 = 0;
      local_108 = 0;
      local_138 = 0;
      local_c8 = 0x7e4;
      do {
        uVar34 = (ulong)dist_cache[lVar19];
        uVar24 = local_160 - uVar34;
        cVar41 = (char)uVar23;
        if ((((lVar19 == 0) || (*(char *)((long)pvVar6 + (uVar24 & 0xffff) + 0x30000) == cVar41)) &&
            (uVar34 <= uVar20)) && (uVar24 < local_160)) {
          puVar25 = (ulong *)(ringbuffer + (uVar24 & ringbuffer_mask));
          uVar43 = local_140;
          puVar37 = puVar18;
          puVar26 = puVar25;
          for (uVar24 = local_140; 7 < uVar24; uVar24 = uVar24 - 8) {
            uVar48 = *puVar37;
            uVar49 = *puVar26;
            if (uVar48 == uVar49) {
              puVar26 = puVar26 + 1;
            }
            else {
              uVar43 = 0;
              if ((uVar49 ^ uVar48) != 0) {
                for (; ((uVar49 ^ uVar48) >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar43 = (long)puVar26 + ((uVar43 >> 3 & 0x1fffffff) - (long)puVar25);
            }
            if (uVar48 != uVar49) goto LAB_01130d1a;
            puVar37 = puVar37 + 1;
          }
          puVar36 = puVar26;
          if (uVar24 != 0) {
            puVar36 = (ulong *)((long)puVar26 + uVar24);
            uVar43 = 0;
            do {
              if (*(char *)((long)puVar26 + uVar43) != *(char *)((long)puVar37 + uVar43)) {
                puVar36 = (ulong *)((long)puVar26 + uVar43);
                break;
              }
              uVar43 = uVar43 + 1;
            } while (uVar24 != uVar43);
          }
          uVar43 = (long)puVar36 - (long)puVar25;
LAB_01130d1a:
          if ((1 < uVar43) && (uVar24 = uVar43 * 0x87 + 0x78f, local_148 < uVar24)) {
            if (lVar19 != 0) {
              uVar24 = uVar24 - ((0x1ca10U >> ((byte)lVar19 & 0xe) & 0xe) + 0x27);
            }
            if (local_148 < uVar24) {
              local_108 = uVar43;
              local_c8 = uVar24;
              local_148 = uVar24;
              local_138 = uVar34;
              local_120 = uVar43;
            }
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 10);
      uVar49 = (ulong)uVar23;
      sVar35 = (hasher->privat)._H5.block_size_;
      uVar43 = local_160 - *(uint *)((long)pvVar6 + uVar49 * 4);
      uVar24 = (ulong)*(ushort *)((long)pvVar6 + uVar49 * 2 + 0x20000);
      uVar48 = 0;
      uVar34 = uVar43;
      do {
        bVar54 = sVar35 == 0;
        sVar35 = sVar35 - 1;
        if (bVar54) break;
        uVar48 = uVar48 + uVar34;
        if (uVar48 <= uVar20) {
          uVar44 = (ulong)*(ushort *)((long)pvVar7 + uVar24 * 4 + 2);
          uVar34 = (ulong)*(ushort *)((long)pvVar7 + uVar24 * 4);
          uVar24 = uVar44;
          if (uVar17 + local_120 <= ringbuffer_mask) {
            uVar47 = local_160 - uVar48 & ringbuffer_mask;
            uVar44 = local_120 + uVar47;
            if ((uVar44 <= ringbuffer_mask) &&
               (ringbuffer[uVar17 + local_120] == ringbuffer[uVar44])) {
              puVar25 = (ulong *)(ringbuffer + uVar47);
              puVar37 = puVar18;
              uVar47 = uVar43;
              puVar26 = puVar25;
              for (uVar44 = local_140; 7 < uVar44; uVar44 = uVar44 - 8) {
                uVar45 = *puVar37;
                uVar46 = *puVar26;
                if (uVar45 == uVar46) {
                  puVar26 = puVar26 + 1;
                }
                else {
                  uVar47 = 0;
                  if ((uVar46 ^ uVar45) != 0) {
                    for (; ((uVar46 ^ uVar45) >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                    }
                  }
                  uVar47 = (long)puVar26 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar25);
                }
                if (uVar45 != uVar46) goto LAB_01130ee0;
                puVar37 = puVar37 + 1;
              }
              puVar36 = puVar26;
              if (uVar44 != 0) {
                puVar36 = (ulong *)(uVar44 + (long)puVar26);
                uVar47 = 0;
                do {
                  if (*(char *)((long)puVar26 + uVar47) != *(char *)((long)puVar37 + uVar47)) {
                    puVar36 = (ulong *)((long)puVar26 + uVar47);
                    break;
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar44 != uVar47);
              }
              uVar47 = (long)puVar36 - (long)puVar25;
LAB_01130ee0:
              if (3 < uVar47) {
                iVar28 = 0x1f;
                if ((uint)uVar48 != 0) {
                  for (; (uint)uVar48 >> iVar28 == 0; iVar28 = iVar28 + -1) {
                  }
                }
                uVar44 = (ulong)(iVar28 * -0x1e + 0x780) + uVar47 * 0x87;
                if (local_148 < uVar44) {
                  local_108 = uVar47;
                  local_c8 = uVar44;
                  local_148 = uVar44;
                  local_138 = uVar48;
                  local_120 = uVar47;
                }
              }
            }
          }
        }
      } while (uVar48 <= uVar20);
      uVar39 = (hasher->privat)._H42.free_slot_idx[0];
      (hasher->privat)._H42.free_slot_idx[0] = uVar39 + 1;
      if (0xfffe < uVar43) {
        uVar43 = 0xffff;
      }
      *(char *)((long)pvVar6 + (local_160 & 0xffff) + 0x30000) = cVar41;
      *(short *)((long)pvVar7 + (ulong)uVar39 * 4) = (short)uVar43;
      *(undefined2 *)((long)pvVar7 + (ulong)uVar39 * 4 + 2) =
           *(undefined2 *)((long)pvVar6 + uVar49 * 2 + 0x20000);
      *(int *)((long)pvVar6 + uVar49 * 4) = (int)local_160;
      *(ushort *)((long)pvVar6 + uVar49 * 2 + 0x20000) = uVar39;
      local_164 = 0;
      if ((local_c8 == 0x7e4) &&
         (pHVar8 = (hasher->privat)._H5.common_,
         pHVar8->dict_num_lookups >> 7 <= pHVar8->dict_num_matches)) {
        uVar17 = (ulong)((uint)((int)*puVar18 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar9 = pBVar5->hash_table_lengths;
        sVar35 = pHVar8->dict_num_lookups;
        local_164 = 0;
        lVar19 = 0;
        do {
          sVar35 = sVar35 + 1;
          pHVar8->dict_num_lookups = sVar35;
          bVar21 = puVar9[uVar17];
          uVar24 = (ulong)bVar21;
          if (uVar24 != 0) {
            bVar54 = true;
            if (uVar24 <= local_140) {
              pBVar11 = pBVar5->words;
              puVar26 = (ulong *)(pBVar11->data +
                                 (ulong)pBVar11->offsets_by_length[uVar24] +
                                 pBVar5->hash_table_words[uVar17] * uVar24);
              puVar37 = puVar18;
              uVar34 = uVar24;
              if (7 < bVar21) {
                do {
                  uVar43 = *puVar26;
                  uVar48 = *puVar37;
                  if (uVar43 == uVar48) {
                    puVar37 = puVar37 + 1;
                  }
                  else {
                    uVar20 = 0;
                    if ((uVar48 ^ uVar43) != 0) {
                      for (; ((uVar48 ^ uVar43) >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = (long)puVar37 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar18);
                  }
                  if (uVar43 != uVar48) goto LAB_01131117;
                  puVar26 = puVar26 + 1;
                  uVar34 = uVar34 - 8;
                } while (7 < uVar34);
              }
              puVar25 = puVar37;
              if (uVar34 != 0) {
                puVar25 = (ulong *)((long)puVar37 + uVar34);
                uVar20 = 0;
                do {
                  if (*(char *)((long)puVar37 + uVar20) != *(char *)((long)puVar26 + uVar20)) {
                    puVar25 = (ulong *)((long)puVar37 + uVar20);
                    break;
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar34 != uVar20);
              }
              uVar20 = (long)puVar25 - (long)puVar18;
LAB_01131117:
              if (((uVar20 != 0) && (uVar24 < pBVar5->cutoffTransformsCount + uVar20)) &&
                 (uVar24 = (ulong)pBVar5->hash_table_words[uVar17] + uVar38 + lVar1 +
                           ((ulong)((uint)(pBVar5->cutoffTransforms >>
                                          ((char)(uVar24 - uVar20) * '\x06' & 0x3fU)) & 0x3f) +
                            (uVar24 - uVar20) * 4 << (pBVar11->size_bits_by_length[uVar24] & 0x3f)),
                 uVar24 <= uVar27)) {
                iVar28 = 0x1f;
                if ((uint)uVar24 != 0) {
                  for (; (uint)uVar24 >> iVar28 == 0; iVar28 = iVar28 + -1) {
                  }
                }
                uVar34 = (uVar20 * 0x87 - (ulong)(uint)(iVar28 * 0x1e)) + 0x780;
                if (local_c8 <= uVar34) {
                  local_164 = (uint)bVar21 - (int)uVar20;
                  bVar54 = false;
                  local_138 = uVar24;
                  local_108 = uVar20;
                  local_c8 = uVar34;
                }
              }
            }
            if (!bVar54) {
              pHVar8->dict_num_matches = pHVar8->dict_num_matches + 1;
            }
          }
          uVar17 = uVar17 + 1;
          bVar54 = lVar19 == 0;
          lVar19 = lVar19 + 1;
        } while (bVar54);
      }
      if (local_c8 < 0x7e5) {
        local_150 = local_150 + 1;
        position = local_160 + 1;
        if (local_a8 < position) {
          if (position <= (uint)((int)lVar40 * 4) + local_a8) {
            uVar20 = local_160 + 9;
            if (uVar2 - 3 <= local_160 + 9) {
              uVar20 = uVar2 - 3;
            }
            if (uVar20 <= position) goto LAB_01131e80;
            pvVar6 = (hasher->privat)._H40.extra[0];
            pvVar7 = (hasher->privat)._H40.extra[1];
            uVar39 = (hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar23 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar38 = (ulong)uVar23;
              uVar27 = position - *(uint *)((long)pvVar6 + uVar38 * 4);
              *(char *)((long)pvVar6 + (position & 0xffff) + 0x30000) = (char)uVar23;
              if (0xfffe < uVar27) {
                uVar27 = 0xffff;
              }
              uVar22 = uVar39 + 1;
              *(short *)((long)pvVar7 + (ulong)uVar39 * 4) = (short)uVar27;
              *(undefined2 *)((long)pvVar7 + (ulong)uVar39 * 4 + 2) =
                   *(undefined2 *)((long)pvVar6 + uVar38 * 2 + 0x20000);
              *(int *)((long)pvVar6 + uVar38 * 4) = (int)position;
              *(ushort *)((long)pvVar6 + uVar38 * 2 + 0x20000) = uVar39;
              local_150 = local_150 + 2;
              position = position + 2;
              uVar39 = uVar22;
            } while (position < uVar20);
            goto LAB_01131e64;
          }
          uVar20 = local_160 + 0x11;
          if (uVar2 - 4 <= local_160 + 0x11) {
            uVar20 = uVar2 - 4;
          }
          if (position < uVar20) {
            pvVar6 = (hasher->privat)._H40.extra[0];
            pvVar7 = (hasher->privat)._H40.extra[1];
            uVar39 = (hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar23 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar38 = (ulong)uVar23;
              uVar27 = position - *(uint *)((long)pvVar6 + uVar38 * 4);
              *(char *)((long)pvVar6 + (position & 0xffff) + 0x30000) = (char)uVar23;
              if (0xfffe < uVar27) {
                uVar27 = 0xffff;
              }
              uVar22 = uVar39 + 1;
              *(short *)((long)pvVar7 + (ulong)uVar39 * 4) = (short)uVar27;
              *(undefined2 *)((long)pvVar7 + (ulong)uVar39 * 4 + 2) =
                   *(undefined2 *)((long)pvVar6 + uVar38 * 2 + 0x20000);
              *(int *)((long)pvVar6 + uVar38 * 4) = (int)position;
              *(ushort *)((long)pvVar6 + uVar38 * 2 + 0x20000) = uVar39;
              local_150 = local_150 + 4;
              position = position + 4;
              uVar39 = uVar22;
            } while (position < uVar20);
            goto LAB_01131e64;
          }
        }
      }
      else {
        uVar39 = (hasher->privat)._H42.free_slot_idx[0];
        iVar28 = 0;
        do {
          uVar20 = local_160;
          local_140 = local_140 - 1;
          local_118 = local_108 - 1;
          if (local_140 <= local_108 - 1) {
            local_118 = local_140;
          }
          if (4 < params->quality) {
            local_118 = 0;
          }
          uVar38 = local_160 + 1;
          uVar27 = uVar29;
          if (uVar38 < uVar29) {
            uVar27 = uVar38;
          }
          uVar17 = sVar3 + local_160 + 1;
          if (uVar29 <= uVar17) {
            uVar17 = uVar29;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_b4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_d0 + 0x100] |
                              literal_context_lut[ringbuffer[local_160 & ringbuffer_mask]]];
            local_d0 = (ulong)ringbuffer[local_160 & ringbuffer_mask];
          }
          pBVar5 = (params->dictionary).contextual.dict[local_b4];
          uVar24 = (params->dist).max_distance;
          pvVar6 = (hasher->privat)._H40.extra[0];
          pvVar7 = (hasher->privat)._H40.extra[1];
          uVar43 = uVar38 & ringbuffer_mask;
          puVar18 = (ulong *)(ringbuffer + uVar43);
          uVar23 = (uint)(*(int *)(ringbuffer + uVar43) * 0x1e35a7bd) >> 0x11;
          local_128 = 0x7e4;
          lVar19 = 0;
          sVar35 = 0;
          local_f8 = 0;
          uVar34 = 0x7e4;
          do {
            uVar49 = (ulong)dist_cache[lVar19];
            uVar48 = uVar38 - uVar49;
            cVar41 = (char)uVar23;
            if (((lVar19 == 0) || (*(char *)((long)pvVar6 + (uVar48 & 0xffff) + 0x30000) == cVar41))
               && ((uVar49 <= uVar27 && (uVar48 < uVar38)))) {
              puVar25 = (ulong *)(ringbuffer + (uVar48 & ringbuffer_mask));
              uVar44 = local_140;
              puVar37 = puVar18;
              puVar26 = puVar25;
              for (uVar48 = local_140; 7 < uVar48; uVar48 = uVar48 - 8) {
                uVar47 = *puVar37;
                uVar45 = *puVar26;
                if (uVar47 == uVar45) {
                  puVar26 = puVar26 + 1;
                }
                else {
                  uVar44 = 0;
                  if ((uVar45 ^ uVar47) != 0) {
                    for (; ((uVar45 ^ uVar47) >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar44 = (long)puVar26 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar25);
                }
                if (uVar47 != uVar45) goto LAB_011313ef;
                puVar37 = puVar37 + 1;
              }
              puVar36 = puVar26;
              if (uVar48 != 0) {
                puVar36 = (ulong *)((long)puVar26 + uVar48);
                uVar44 = 0;
                do {
                  if (*(char *)((long)puVar26 + uVar44) != *(char *)((long)puVar37 + uVar44)) {
                    puVar36 = (ulong *)((long)puVar26 + uVar44);
                    break;
                  }
                  uVar44 = uVar44 + 1;
                } while (uVar48 != uVar44);
              }
              uVar44 = (long)puVar36 - (long)puVar25;
LAB_011313ef:
              if ((1 < uVar44) && (uVar48 = uVar44 * 0x87 + 0x78f, local_128 < uVar48)) {
                if (lVar19 != 0) {
                  uVar48 = uVar48 - ((0x1ca10U >> ((byte)lVar19 & 0xe) & 0xe) + 0x27);
                }
                if (local_128 < uVar48) {
                  uVar34 = uVar48;
                  sVar35 = uVar44;
                  local_128 = uVar48;
                  local_118 = uVar44;
                  local_f8 = uVar49;
                }
              }
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != 10);
          uVar47 = (ulong)uVar23;
          sVar50 = (hasher->privat)._H5.block_size_;
          uVar45 = uVar38 - *(uint *)((long)pvVar6 + uVar47 * 4);
          uVar49 = (ulong)*(ushort *)((long)pvVar6 + uVar47 * 2 + 0x20000);
          uVar44 = 0;
          uVar48 = uVar45;
          do {
            bVar54 = sVar50 == 0;
            sVar50 = sVar50 - 1;
            uVar46 = sVar35;
            if (bVar54) break;
            uVar44 = uVar44 + uVar48;
            uVar51 = local_118;
            uVar53 = uVar34;
            uVar10 = local_128;
            uVar14 = local_f8;
            if (uVar44 <= uVar27) {
              uVar30 = (ulong)*(ushort *)((long)pvVar7 + uVar49 * 4 + 2);
              uVar48 = (ulong)*(ushort *)((long)pvVar7 + uVar49 * 4);
              uVar49 = uVar30;
              if (uVar43 + local_118 <= ringbuffer_mask) {
                uVar52 = uVar38 - uVar44 & ringbuffer_mask;
                uVar30 = uVar52 + local_118;
                if ((ringbuffer_mask < uVar30) ||
                   (ringbuffer[uVar43 + local_118] != ringbuffer[uVar30])) goto LAB_0113159d;
                puVar25 = (ulong *)(ringbuffer + uVar52);
                uVar46 = local_140;
                puVar37 = puVar18;
                puVar26 = puVar25;
                for (uVar51 = local_140; 7 < uVar51; uVar51 = uVar51 - 8) {
                  uVar53 = *puVar37;
                  uVar10 = *puVar26;
                  if (uVar53 == uVar10) {
                    puVar26 = puVar26 + 1;
                  }
                  else {
                    uVar46 = 0;
                    if ((uVar10 ^ uVar53) != 0) {
                      for (; ((uVar10 ^ uVar53) >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar46 = (long)puVar26 + ((uVar46 >> 3 & 0x1fffffff) - (long)puVar25);
                  }
                  if (uVar53 != uVar10) goto LAB_011315ba;
                  puVar37 = puVar37 + 1;
                }
                puVar36 = puVar26;
                if (uVar51 != 0) {
                  puVar36 = (ulong *)((long)puVar26 + uVar51);
                  uVar46 = 0;
                  do {
                    if (*(char *)((long)puVar26 + uVar46) != *(char *)((long)puVar37 + uVar46)) {
                      puVar36 = (ulong *)((long)puVar26 + uVar46);
                      break;
                    }
                    uVar46 = uVar46 + 1;
                  } while (uVar51 != uVar46);
                }
                uVar46 = (long)puVar36 - (long)puVar25;
LAB_011315ba:
                if (3 < uVar46) {
                  iVar42 = 0x1f;
                  if ((uint)uVar44 != 0) {
                    for (; (uint)uVar44 >> iVar42 == 0; iVar42 = iVar42 + -1) {
                    }
                  }
                  uVar53 = (ulong)(iVar42 * -0x1e + 0x780) + uVar46 * 0x87;
                  uVar51 = uVar46;
                  uVar10 = uVar53;
                  uVar14 = uVar44;
                  if (local_128 < uVar53) goto LAB_0113159d;
                }
              }
              uVar46 = sVar35;
              uVar51 = local_118;
              uVar53 = uVar34;
              uVar10 = local_128;
              uVar14 = local_f8;
            }
LAB_0113159d:
            local_f8 = uVar14;
            local_128 = uVar10;
            uVar34 = uVar53;
            local_118 = uVar51;
            sVar35 = uVar46;
          } while (uVar44 <= uVar27);
          (hasher->privat)._H42.free_slot_idx[0] = uVar39 + 1;
          *(char *)((long)pvVar6 + (uVar38 & 0xffff) + 0x30000) = cVar41;
          if (0xfffe < uVar45) {
            uVar45 = 0xffff;
          }
          *(short *)((long)pvVar7 + (ulong)uVar39 * 4) = (short)uVar45;
          *(undefined2 *)((long)pvVar7 + (ulong)uVar39 * 4 + 2) =
               *(undefined2 *)((long)pvVar6 + uVar47 * 2 + 0x20000);
          *(int *)((long)pvVar6 + uVar47 * 4) = (int)uVar38;
          *(ushort *)((long)pvVar6 + uVar47 * 2 + 0x20000) = uVar39;
          if ((uVar34 == 0x7e4) &&
             (pHVar8 = (hasher->privat)._H5.common_,
             pHVar8->dict_num_lookups >> 7 <= pHVar8->dict_num_matches)) {
            uVar27 = (ulong)((uint)((int)*puVar18 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            puVar9 = pBVar5->hash_table_lengths;
            sVar35 = pHVar8->dict_num_lookups;
            iVar42 = 0;
            lVar19 = 0;
            do {
              sVar35 = sVar35 + 1;
              pHVar8->dict_num_lookups = sVar35;
              bVar21 = puVar9[uVar27];
              uVar43 = (ulong)bVar21;
              if (uVar43 != 0) {
                bVar54 = true;
                if (uVar43 <= local_140) {
                  pBVar11 = pBVar5->words;
                  puVar26 = (ulong *)(pBVar11->data +
                                     (ulong)pBVar11->offsets_by_length[uVar43] +
                                     pBVar5->hash_table_words[uVar27] * uVar43);
                  puVar37 = puVar18;
                  sVar50 = ringbuffer_mask;
                  uVar48 = uVar43;
                  if (7 < bVar21) {
                    do {
                      uVar49 = *puVar26;
                      uVar44 = *puVar37;
                      if (uVar49 == uVar44) {
                        puVar37 = puVar37 + 1;
                      }
                      else {
                        uVar47 = 0;
                        if ((uVar44 ^ uVar49) != 0) {
                          for (; ((uVar44 ^ uVar49) >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                          }
                        }
                        sVar50 = (long)puVar37 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar18);
                      }
                      if (uVar49 != uVar44) goto LAB_01131835;
                      puVar26 = puVar26 + 1;
                      uVar48 = uVar48 - 8;
                    } while (7 < uVar48);
                  }
                  if (uVar48 != 0) {
                    uVar49 = 0;
                    do {
                      uVar44 = uVar49;
                      if (*(char *)((long)puVar37 + uVar49) != *(char *)((long)puVar26 + uVar49))
                      break;
                      uVar49 = uVar49 + 1;
                      uVar44 = uVar48;
                    } while (uVar48 != uVar49);
                    puVar37 = (ulong *)((long)puVar37 + uVar44);
                  }
                  sVar50 = (long)puVar37 - (long)puVar18;
LAB_01131835:
                  bVar54 = true;
                  if ((sVar50 != 0) && (uVar43 < pBVar5->cutoffTransformsCount + sVar50)) {
                    uVar43 = (ulong)pBVar5->hash_table_words[uVar27] + uVar17 + lVar1 +
                             ((ulong)((uint)(pBVar5->cutoffTransforms >>
                                            ((char)(uVar43 - sVar50) * '\x06' & 0x3fU)) & 0x3f) +
                              (uVar43 - sVar50) * 4 << (pBVar11->size_bits_by_length[uVar43] & 0x3f)
                             );
                    if (uVar24 < uVar43) {
                      bVar54 = true;
                    }
                    else {
                      iVar13 = 0x1f;
                      if ((uint)uVar43 != 0) {
                        for (; (uint)uVar43 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                        }
                      }
                      uVar48 = (sVar50 * 0x87 - (ulong)(uint)(iVar13 * 0x1e)) + 0x780;
                      bVar54 = true;
                      if (uVar34 <= uVar48) {
                        iVar42 = (uint)bVar21 - (int)sVar50;
                        bVar54 = false;
                        uVar46 = sVar50;
                        uVar34 = uVar48;
                        local_f8 = uVar43;
                      }
                    }
                  }
                }
                if (!bVar54) {
                  pHVar8->dict_num_matches = pHVar8->dict_num_matches + 1;
                }
              }
              uVar27 = uVar27 + 1;
              bVar54 = lVar19 == 0;
              lVar19 = lVar19 + 1;
            } while (bVar54);
          }
          else {
            iVar42 = 0;
          }
          bVar54 = local_c8 + 0xaf <= uVar34;
          iVar13 = iVar28;
          if (bVar54) {
            local_150 = local_150 + 1;
            local_138 = local_f8;
            local_c8 = uVar34;
            local_164 = iVar42;
            local_160 = uVar38;
            local_108 = uVar46;
            iVar13 = iVar28 + 1;
          }
          bVar12 = iVar28 < 3;
          uVar39 = uVar39 + 1;
          iVar28 = iVar13;
        } while (bVar54 && (bVar12 && uVar20 + 5 < uVar2));
        uVar20 = sVar3 + local_160;
        if (uVar29 <= sVar3 + local_160) {
          uVar20 = uVar29;
        }
        uVar20 = uVar20 + sVar4;
        if (uVar20 < local_138) {
LAB_01131b58:
          uVar38 = local_138 + 0xf;
        }
        else {
          uVar23 = 0;
          bVar54 = false;
          if (local_138 != (long)*dist_cache) {
            if (local_138 == (long)dist_cache[1]) {
              uVar23 = 1;
            }
            else {
              uVar38 = (local_138 + 3) - (long)*dist_cache;
              if (uVar38 < 7) {
                bVar21 = (byte)((int)uVar38 << 2);
                uVar23 = 0x9750468;
              }
              else {
                uVar38 = (local_138 + 3) - (long)dist_cache[1];
                if (6 < uVar38) {
                  if (local_138 != (long)dist_cache[2]) {
                    bVar54 = local_138 != (long)dist_cache[3];
                    uVar23 = 3;
                    goto LAB_01131b4f;
                  }
                  uVar23 = 2;
                  goto LAB_01131b4d;
                }
                bVar21 = (byte)((int)uVar38 << 2);
                uVar23 = 0xfdb1ace;
              }
              uVar23 = uVar23 >> (bVar21 & 0x1f) & 0xf;
            }
LAB_01131b4d:
            bVar54 = false;
          }
LAB_01131b4f:
          if (bVar54) goto LAB_01131b58;
          uVar38 = (ulong)uVar23;
        }
        if ((local_138 <= uVar20) && (uVar38 != 0)) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          iVar28 = (int)local_138;
          *dist_cache = iVar28;
          dist_cache[4] = iVar28 + -1;
          dist_cache[5] = iVar28 + 1;
          dist_cache[6] = iVar28 + -2;
          dist_cache[7] = iVar28 + 2;
          dist_cache[8] = iVar28 + -3;
          dist_cache[9] = iVar28 + 3;
        }
        uVar23 = (uint)local_150;
        local_e8->insert_len_ = uVar23;
        local_e8->copy_len_ = local_164 << 0x19 | (uint)local_108;
        uVar27 = (ulong)(params->dist).num_direct_distance_codes;
        uVar20 = uVar27 + 0x10;
        if (uVar38 < uVar20) {
          local_e8->dist_prefix_ = (uint16_t)uVar38;
          uVar15 = 0;
        }
        else {
          uVar15 = (params->dist).distance_postfix_bits;
          bVar21 = (byte)uVar15;
          uVar38 = ((uVar38 - uVar27) + (4L << (bVar21 & 0x3f))) - 0x10;
          uVar32 = 0x1f;
          if ((uint)uVar38 != 0) {
            for (; (uint)uVar38 >> uVar32 == 0; uVar32 = uVar32 - 1) {
            }
          }
          uVar32 = (uVar32 ^ 0xffffffe0) + 0x1f;
          bVar54 = (uVar38 >> ((ulong)uVar32 & 0x3f) & 1) != 0;
          iVar28 = uVar32 - uVar15;
          local_e8->dist_prefix_ =
               (short)((uint)bVar54 + iVar28 * 2 + 0xfffe << (bVar21 & 0x3f)) +
               (short)uVar20 + (~(ushort)(-1 << (bVar21 & 0x1f)) & (ushort)uVar38) |
               (short)iVar28 * 0x400;
          uVar15 = (uint32_t)
                   (uVar38 - ((ulong)bVar54 + 2 << ((byte)uVar32 & 0x3f)) >> (bVar21 & 0x3f));
        }
        local_e8->dist_extra_ = uVar15;
        if (5 < local_150) {
          if (local_150 < 0x82) {
            uVar23 = 0x1f;
            uVar32 = (uint)(local_150 - 2);
            if (uVar32 != 0) {
              for (; uVar32 >> uVar23 == 0; uVar23 = uVar23 - 1) {
              }
            }
            uVar23 = (int)(local_150 - 2 >> ((char)(uVar23 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar23 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_150 < 0x842) {
            uVar32 = 0x1f;
            if (uVar23 - 0x42 != 0) {
              for (; uVar23 - 0x42 >> uVar32 == 0; uVar32 = uVar32 - 1) {
              }
            }
            uVar23 = (uVar32 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar23 = 0x15;
            if (0x1841 < local_150) {
              uVar23 = (uint)(ushort)(0x17 - (local_150 < 0x5842));
            }
          }
        }
        uVar32 = local_164 + (uint)local_108;
        if (uVar32 < 10) {
          uVar33 = uVar32 - 2;
        }
        else if (uVar32 < 0x86) {
          uVar32 = uVar32 - 6;
          uVar33 = 0x1f;
          if (uVar32 != 0) {
            for (; uVar32 >> uVar33 == 0; uVar33 = uVar33 - 1) {
            }
          }
          uVar33 = (int)((ulong)(long)(int)uVar32 >> ((char)(uVar33 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar33 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar33 = 0x17;
          if (uVar32 < 0x846) {
            uVar33 = 0x1f;
            if (uVar32 - 0x46 != 0) {
              for (; uVar32 - 0x46 >> uVar33 == 0; uVar33 = uVar33 - 1) {
              }
            }
            uVar33 = (uVar33 ^ 0xffe0) + 0x2c;
          }
        }
        uVar39 = (ushort)uVar33;
        uVar31 = (uVar39 & 7) + ((ushort)uVar23 & 7) * 8;
        if ((((local_e8->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar23 < 8)) && (uVar39 < 0x10)) {
          if (7 < uVar39) {
            uVar31 = uVar31 + 0x40;
          }
        }
        else {
          iVar28 = ((uVar23 & 0xffff) >> 3) * 3 + ((uVar33 & 0xffff) >> 3);
          uVar31 = uVar31 + ((ushort)(0x520d40 >> ((char)iVar28 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar28 * 0x40 + 0x40;
        }
        local_e8->cmd_prefix_ = uVar31;
        *num_literals = *num_literals + local_150;
        position = local_160 + local_108;
        uVar20 = uVar16;
        if (position < uVar16) {
          uVar20 = position;
        }
        uVar38 = local_160 + 2;
        if (local_138 < local_108 >> 2) {
          uVar27 = position + local_138 * -4;
          if (uVar27 < uVar38) {
            uVar27 = uVar38;
          }
          uVar38 = uVar27;
          if (uVar20 < uVar27) {
            uVar38 = uVar20;
          }
        }
        local_a8 = lVar40 + local_108 * 2 + local_160;
        local_e8 = local_e8 + 1;
        if (uVar38 < uVar20) {
          pvVar6 = (hasher->privat)._H40.extra[0];
          pvVar7 = (hasher->privat)._H40.extra[1];
          uVar39 = (hasher->privat)._H42.free_slot_idx[0];
          do {
            uVar23 = (uint)(*(int *)(ringbuffer + (uVar38 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
            uVar27 = (ulong)uVar23;
            uVar17 = uVar38 - *(uint *)((long)pvVar6 + uVar27 * 4);
            *(char *)((long)pvVar6 + (uVar38 & 0xffff) + 0x30000) = (char)uVar23;
            if (0xfffe < uVar17) {
              uVar17 = 0xffff;
            }
            uVar22 = uVar39 + 1;
            *(short *)((long)pvVar7 + (ulong)uVar39 * 4) = (short)uVar17;
            *(undefined2 *)((long)pvVar7 + (ulong)uVar39 * 4 + 2) =
                 *(undefined2 *)((long)pvVar6 + uVar27 * 2 + 0x20000);
            *(int *)((long)pvVar6 + uVar27 * 4) = (int)uVar38;
            *(ushort *)((long)pvVar6 + uVar27 * 2 + 0x20000) = uVar39;
            uVar38 = uVar38 + 1;
            uVar39 = uVar22;
          } while (uVar20 != uVar38);
          local_150 = 0;
LAB_01131e64:
          (hasher->privat)._H42.free_slot_idx[0] = uVar22;
        }
        else {
          local_150 = 0;
        }
      }
LAB_01131e80:
      local_160 = position;
    } while (position + 4 < uVar2);
  }
  else {
    local_e8 = commands;
  }
  *last_insert_len = (local_150 + uVar2) - position;
  *num_commands = *num_commands + ((long)local_e8 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}